

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::Handler<capnproto_test::capnp::test::TestInterface,_(capnp::Style)3>::decodeBase
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,
          Handler<capnproto_test::capnp::test::TestInterface,_(capnp::Style)3> *this,
          JsonCodec *codec,Reader input,Type type,Orphanage orphanage)

{
  undefined8 in_R9;
  undefined1 local_48 [24];
  OrphanBuilder local_30;
  
  (*(this->super_HandlerBase)._vptr_HandlerBase[4])
            ((Client *)local_48,this,codec,type._0_8_,type.field_4.schema,in_R9,
             input._reader.segment._0_4_,input._reader.capTable._0_4_,input._reader.data._0_4_,
             input._reader.pointers._0_4_,input._reader.dataSize,input._reader.nestingLimit);
  Orphanage::newOrphanCopy<capnproto_test::capnp::test::TestInterface::Client>
            ((Orphan<capnproto_test::capnp::test::TestInterface> *)&local_30,&orphanage,
             (Client *)local_48);
  Orphan<capnp::DynamicValue>::Orphan<capnproto_test::capnp::test::TestInterface>
            (__return_storage_ptr__,(Orphan<capnproto_test::capnp::test::TestInterface> *)&local_30)
  ;
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_30);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_48 + 8));
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> decodeBase(const JsonCodec& codec, JsonValue::Reader input,
                                  Type type, Orphanage orphanage) const override final {
    return orphanage.newOrphanCopy(decode(codec, input));
  }